

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_solve_for_update.c
# Opt level: O1

lu_int basiclu_solve_for_update
                 (lu_int *istore,double *xstore,lu_int *Li,double *Lx,lu_int *Ui,double *Ux,
                 lu_int *Wi,double *Wx,lu_int nzrhs,lu_int *irhs,double *xrhs,lu_int *p_nzlhs,
                 lu_int *ilhs,double *lhs,char trans)

{
  lu_int lVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  lu_int *plVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  lu this;
  
  plVar5 = Ui;
  lVar1 = lu_load(&this,istore,xstore,Li,Lx,Ui,Ux,Wi,Wx);
  if (lVar1 != 0) {
    return lVar1;
  }
  auVar7._0_4_ = -(uint)(Li == (lu_int *)0x0);
  auVar7._4_4_ = -(uint)(Lx == (double *)0x0);
  auVar7._8_4_ = -(uint)(Ui == (lu_int *)0x0);
  auVar7._12_4_ = -(uint)(Ux == (double *)0x0);
  iVar4 = movmskps((int)plVar5,auVar7);
  bVar2 = false;
  lVar1 = -3;
  bVar3 = false;
  if ((((iVar4 == 0) && (bVar3 = bVar2, Wi != (lu_int *)0x0)) && (Wx != (double *)0x0)) &&
     (irhs != (lu_int *)0x0)) {
    if (xrhs != (double *)0x0 || (trans & 0xdfU) == 0x54) {
      if (this.nupdate < 0) {
        lVar1 = -2;
      }
      else {
        if (this.nforrest != this.m) {
          if ((trans & 0xdfU) == 0x54) {
            bVar3 = -1 < *irhs && *irhs < this.m;
          }
          else if (nzrhs < 1 || this.m < nzrhs) {
            bVar3 = -1 < nzrhs && nzrhs <= this.m;
          }
          else {
            uVar6 = 1;
            do {
              bVar3 = irhs[uVar6 - 1] < this.m && -1 < irhs[uVar6 - 1];
              if ((uint)nzrhs <= uVar6) break;
              uVar6 = uVar6 + 1;
            } while (bVar3);
          }
          lVar1 = (uint)bVar3 * 4 + -4;
          goto LAB_003ba8d1;
        }
        lVar1 = -5;
      }
    }
    bVar3 = false;
  }
LAB_003ba8d1:
  if (bVar3 != false) {
    lVar1 = lu_solve_for_update(&this,nzrhs,irhs,xrhs,p_nzlhs,ilhs,lhs,trans);
  }
  lVar1 = lu_save(&this,istore,xstore,lVar1);
  return lVar1;
}

Assistant:

lu_int basiclu_solve_for_update
(
    lu_int istore[],
    double xstore[],
    lu_int Li[],
    double Lx[],
    lu_int Ui[],
    double Ux[],
    lu_int Wi[],
    double Wx[],
    lu_int nzrhs,
    const lu_int irhs[],
    const double xrhs[],
    lu_int *p_nzlhs,
    lu_int ilhs[],
    double lhs[],
    char trans
)
{
    struct lu this;
    lu_int status, n, ok;

    status = lu_load(&this, istore, xstore, Li, Lx, Ui, Ux, Wi, Wx);
    if (status != BASICLU_OK)
        return status;

    if (! (Li && Lx && Ui && Ux && Wi && Wx && irhs))
    {
        status = BASICLU_ERROR_argument_missing;
    }
    else if (trans != 't' && trans != 'T' && !xrhs)
    {
        status = BASICLU_ERROR_argument_missing;
    }
    else if (this.nupdate < 0)
    {
        status = BASICLU_ERROR_invalid_call;
    }
    else if (this.nforrest == this.m)
    {
        status = BASICLU_ERROR_maximum_updates;
    }
    else
    {
        /* check RHS indices */
        if (trans == 't' || trans == 'T')
        {
            ok = irhs[0] >= 0 && irhs[0] < this.m;
        }
        else
        {
            ok = nzrhs >= 0 && nzrhs <= this.m;
            for (n = 0; n < nzrhs && ok; n++)
            {
                ok = ok && irhs[n] >= 0 && irhs[n] < this.m;
            }
        }
        if (!ok)
            status = BASICLU_ERROR_invalid_argument;
    }

    if (status == BASICLU_OK)
    {
        /* may request reallocation */
        status = lu_solve_for_update(&this, nzrhs, irhs, xrhs, p_nzlhs, ilhs,
                                     lhs, trans);
    }

    return lu_save(&this, istore, xstore, status);
}